

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

string * helics::stateString_abi_cxx11_(ConnectionState state)

{
  int iVar1;
  
  if ((stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::
                                   connected_abi_cxx11_), iVar1 != 0)) {
    stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_._M_dataplus._M_p =
         (pointer)&stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_,
               "connected","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_)
     , iVar1 != 0)) {
    stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_._M_dataplus._M_p =
         (pointer)&stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_,
               "init_requested","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::
                                   operating_abi_cxx11_), iVar1 != 0)) {
    stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_._M_dataplus._M_p =
         (pointer)&stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_,
               "operating","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::
                                   estate_abi_cxx11_), iVar1 != 0)) {
    stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_._M_dataplus._M_p =
         (pointer)&stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_,"error"
               ,"");
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_);
  }
  if ((stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_),
     iVar1 != 0)) {
    stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_._M_dataplus._M_p =
         (pointer)&stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_,
               "disconnected","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_);
  }
  if (state < OPERATING) {
    if (state == CONNECTED) {
      return &stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_;
    }
    if (state == INIT_REQUESTED) {
      return &stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_;
    }
  }
  else {
    if (state == OPERATING) {
      return &stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_;
    }
    if ((state == REQUEST_DISCONNECT) || (state == DISCONNECTED)) {
      return &stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_;
    }
  }
  return &stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_;
}

Assistant:

static const std::string& stateString(ConnectionState state)
{
    static const std::string connected{"connected"};
    static const std::string init{"init_requested"};
    static const std::string operating{"operating"};
    static const std::string estate{"error"};
    static const std::string dis{"disconnected"};
    switch (state) {
        case ConnectionState::OPERATING:
            return operating;
        case ConnectionState::INIT_REQUESTED:
            return init;
        case ConnectionState::CONNECTED:
            return connected;
        case ConnectionState::REQUEST_DISCONNECT:
        case ConnectionState::DISCONNECTED:
            return dis;
        case ConnectionState::ERROR_STATE:
        default:
            return estate;
    }
}